

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  size_t sVar1;
  byte bVar2;
  char_t *pcVar3;
  char_t *pcVar4;
  byte *s_00;
  byte *pbVar5;
  gap g;
  gap local_38;
  
  local_38.end = (byte *)0x0;
  local_38.size = 0;
  pbVar5 = s;
LAB_00103271:
  sVar1 = local_38.size;
  bVar2 = *pbVar5;
  s_00 = pbVar5;
  if (((anonymous_namespace)::chartype_table[bVar2] & 1) == 0) {
    pbVar5 = pbVar5 + 2;
    do {
      s_00 = pbVar5;
      bVar2 = s_00[-1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        s_00 = s_00 + -1;
        goto LAB_001032c7;
      }
      bVar2 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) goto LAB_001032c7;
      bVar2 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_001032c7;
      }
      bVar2 = s_00[2];
      pbVar5 = s_00 + 4;
    } while (((anonymous_namespace)::chartype_table[bVar2] & 1) == 0);
    s_00 = s_00 + 2;
  }
LAB_001032c7:
  if (bVar2 == 0xd) {
    *s_00 = 10;
    pbVar5 = s_00 + 1;
    if (s_00[1] == 10) {
      if (local_38.end != (byte *)0x0) {
        if (pbVar5 < local_38.end) {
          __assert_fail("s >= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x974,
                        "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
        }
        memmove(local_38.end + -local_38.size,local_38.end,(long)pbVar5 - (long)local_38.end);
      }
      pbVar5 = s_00 + 2;
      local_38.size = sVar1 + 1;
      local_38.end = pbVar5;
    }
    goto LAB_00103271;
  }
  if (bVar2 == 0) {
    pcVar3 = gap::flush(&local_38,s_00);
    goto LAB_00103371;
  }
  if (bVar2 != 0x3c) {
    pbVar5 = s_00 + 1;
    goto LAB_00103271;
  }
  pcVar3 = gap::flush(&local_38,s_00);
  do {
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
    pcVar3 = pcVar4 + -1;
  } while (((anonymous_namespace)::chartype_table[pcVar4[-1]] & 8) != 0);
  *pcVar4 = '\0';
  return s_00 + 1;
  while (pcVar3 = pcVar4 + -1, ((anonymous_namespace)::chartype_table[pcVar4[-1]] & 8) != 0) {
LAB_00103371:
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
  }
  *pcVar4 = '\0';
  return s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}